

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

LexerState * lexer_OpenFile(char *path)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  LexerState *__ptr;
  int *piVar4;
  char *pcVar5;
  char *fmt;
  stat fileInfo;
  stat local_c0;
  
  if (*path == '-') {
    cVar1 = path[1];
    __ptr = (LexerState *)malloc(0xb8);
    if (__ptr == (LexerState *)0x0) {
LAB_0010c835:
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      error("Failed to allocate memory for lexer state: %s\n",pcVar5);
      return (LexerState *)0x0;
    }
    if (cVar1 != '\0') goto LAB_0010c7f5;
    __ptr->path = "<stdin>";
    __ptr->isFile = true;
    (__ptr->field_2).field_1.fd = 0;
    bVar2 = true;
    goto LAB_0010c7d4;
  }
  __ptr = (LexerState *)malloc(0xb8);
  if (__ptr == (LexerState *)0x0) goto LAB_0010c835;
LAB_0010c7f5:
  iVar3 = stat(path,&local_c0);
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fmt = "Failed to stat file \"%s\": %s\n";
LAB_0010c819:
    error(fmt,path,pcVar5);
    free(__ptr);
    return (LexerState *)0x0;
  }
  __ptr->path = path;
  __ptr->isFile = true;
  iVar3 = open(path,0);
  (__ptr->field_2).field_1.fd = iVar3;
  if (iVar3 < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fmt = "Failed to open file \"%s\": %s\n";
    goto LAB_0010c819;
  }
  __ptr->isMmapped = false;
  if (local_c0.st_size < 1) {
    bVar2 = false;
  }
  else {
    pcVar5 = (char *)mmap((void *)0x0,local_c0.st_size,1,2,iVar3,0);
    if (pcVar5 != (char *)0xffffffffffffffff) {
LAB_0010c8af:
      close(iVar3);
      __ptr->isMmapped = true;
      (__ptr->field_2).field_0.isReferenced = false;
      (__ptr->field_2).field_0.ptr = pcVar5;
      (__ptr->field_2).field_0.size = local_c0.st_size;
      (__ptr->field_2).field_0.offset = 0;
      if (verbose == true) {
        printf("File %s successfully mmap()ped\n",path);
      }
      goto LAB_0010c9d1;
    }
    piVar4 = __errno_location();
    if (*piVar4 == 0x5f) {
      if (verbose == true) {
        printf("mmap(%s, MAP_PRIVATE) failed, retrying with MAP_SHARED\n",path);
      }
      bVar2 = false;
      pcVar5 = (char *)mmap((void *)0x0,local_c0.st_size,1,1,iVar3,0);
      if (pcVar5 != (char *)0xffffffffffffffff) goto LAB_0010c8af;
    }
    else {
      bVar2 = false;
    }
LAB_0010c7d4:
    __ptr->isMmapped = false;
    local_c0.st_size = 1;
  }
  if (verbose == true) {
    if (bVar2) {
      puts("Opening stdin");
    }
    else if (local_c0.st_size == 0) {
      printf("File %s is empty\n",path);
    }
    else {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("File %s opened as regular, errno reports \"%s\"\n",path,pcVar5);
    }
  }
  (__ptr->field_2).field_0.size = 0;
  (__ptr->field_2).field_1.nbChars = 0;
LAB_0010c9d1:
  __ptr->mode = LEXER_NORMAL;
  __ptr->atLineStart = true;
  __ptr->lastToken = 0;
  __ptr->ifStack = (IfStack *)0x0;
  __ptr->capturing = false;
  __ptr->captureBuf = (char *)0x0;
  __ptr->disableMacroArgs = false;
  __ptr->disableInterpolation = false;
  __ptr->macroArgScanDistance = 0;
  __ptr->expandStrings = true;
  __ptr->expansions = (Expansion *)0x0;
  __ptr->lineNo = 0;
  return __ptr;
}

Assistant:

struct LexerState *lexer_OpenFile(char const *path)
{
	bool isStdin = !strcmp(path, "-");
	struct LexerState *state = (struct LexerState *)malloc(sizeof(*state));
	struct stat fileInfo;

	// Give stdin a nicer file name
	if (isStdin)
		path = "<stdin>";
	if (!state) {
		error("Failed to allocate memory for lexer state: %s\n", strerror(errno));
		return NULL;
	}
	if (!isStdin && stat(path, &fileInfo) != 0) {
		error("Failed to stat file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->path = path;
	state->isFile = true;
	state->fd = isStdin ? STDIN_FILENO : open(path, O_RDONLY);
	if (state->fd < 0) {
		error("Failed to open file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->isMmapped = false; // By default, assume it won't be mmap()ed
	if (!isStdin && fileInfo.st_size > 0) {
		// Try using `mmap` for better performance

		// Important: do NOT assign to `state->ptr` directly, to avoid a cast that may
		// alter an eventual `MAP_FAILED` value. It would also invalidate `state->fd`,
		// being on the other side of the union.
		void *mappingAddr;

		mapFile(mappingAddr, state->fd, state->path, fileInfo.st_size);
		if (mappingAddr == MAP_FAILED) {
			// If mmap()ing failed, try again using another method (below)
			state->isMmapped = false;
		} else {
			// IMPORTANT: the `union` mandates this is accessed before other members!
			close(state->fd);

			state->isMmapped = true;
			state->isReferenced = false; // By default, a state isn't referenced
			state->ptr = (char *)mappingAddr;
			assert(fileInfo.st_size >= 0);
			state->size = (size_t)fileInfo.st_size;
			state->offset = 0;

			if (verbose)
				printf("File %s successfully mmap()ped\n", path);
		}
	}
	if (!state->isMmapped) {
		// Sometimes mmap() fails or isn't available, so have a fallback
		if (verbose) {
			if (isStdin)
				printf("Opening stdin\n");
			else if (fileInfo.st_size == 0)
				printf("File %s is empty\n", path);
			else
				printf("File %s opened as regular, errno reports \"%s\"\n",
				       path, strerror(errno));
		}
		state->index = 0;
		state->nbChars = 0;
	}

	initState(state);
	state->lineNo = 0; // Will be incremented at first line start
	return state;
}